

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

mstate init_user_mstate(char *tbase,size_t tsize)

{
  char *pcVar1;
  mstate __s;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(-(int)tbase - 0x10U & 0xf);
  pcVar1 = tbase + uVar4;
  __s = (mstate)(tbase + uVar4 + 0x10);
  memset(__s,0,0x3b0);
  __s[-1].exts = 0x3b3;
  __s->least_addr = tbase;
  (__s->seg).base = tbase;
  __s->max_footprint = tsize;
  __s->footprint = tsize;
  (__s->seg).size = tsize;
  __s->magic = mparams.magic;
  __s->release_checks = 0xfff;
  uVar2 = mparams.default_mflags | 4;
  __s->extp = (void *)0x0;
  __s->exts = 0;
  __s->mflags = uVar2;
  pcVar3 = tbase + uVar4 + 0x58;
  lVar5 = 0x20;
  do {
    *(char **)(pcVar3 + 0x18) = pcVar3;
    *(char **)(pcVar3 + 0x10) = pcVar3;
    pcVar3 = pcVar3 + 0x10;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  uVar4 = (ulong)(-(int)pcVar1 - 0x3c0U & 0xf);
  *(char **)(pcVar1 + 0x38) = pcVar1 + uVar4 + 0x3b0;
  *(char **)(pcVar1 + 0x20) = tbase + ((tsize - (long)(pcVar1 + 0x3b0)) - uVar4) + -0x50;
  *(ulong *)(pcVar1 + uVar4 + 0x3b0 + 8) =
       (ulong)(tbase + ((tsize - (long)(pcVar1 + 0x3b0)) - uVar4) + -0x50) | 1;
  pcVar3 = tbase + (tsize - 0x48);
  pcVar3[0] = 'P';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  *(size_t *)(pcVar1 + 0x40) = mparams.trim_threshold;
  return __s;
}

Assistant:

static mstate init_user_mstate(char* tbase, size_t tsize) {
  size_t msize = pad_request(sizeof(struct malloc_state));
  mchunkptr mn;
  mchunkptr msp = align_as_chunk(tbase);
  mstate m = (mstate)(chunk2mem(msp));
  memset(m, 0, msize);
  (void)INITIAL_LOCK(&m->mutex);
  msp->head = (msize|INUSE_BITS);
  m->seg.base = m->least_addr = tbase;
  m->seg.size = m->footprint = m->max_footprint = tsize;
  m->magic = mparams.magic;
  m->release_checks = MAX_RELEASE_CHECK_RATE;
  m->mflags = mparams.default_mflags;
  m->extp = 0;
  m->exts = 0;
  disable_contiguous(m);
  init_bins(m);
  mn = next_chunk(mem2chunk(m));
  init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) - TOP_FOOT_SIZE);
  check_top_chunk(m, m->top);
  return m;
}